

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

void tb_invalidate_phys_page_fast_mipsel
               (uc_struct_conflict5 *uc,page_collection *pages,tb_page_addr_t start,int len,
               uintptr_t retaddr)

{
  uint uVar1;
  uint uVar2;
  PageDesc *pages_00;
  unsigned_long *puVar3;
  uintptr_t in_R9;
  ulong uVar4;
  uint *puVar5;
  
  pages_00 = page_find_alloc(uc,start >> 0xc,0);
  if (pages_00 != (PageDesc *)0x0) {
    puVar3 = pages_00->code_bitmap;
    if (puVar3 == (unsigned_long *)0x0) {
      uVar1 = pages_00->code_write_count + 1;
      pages_00->code_write_count = uVar1;
      if (uVar1 < 10) goto LAB_007e8bae;
      puVar3 = (unsigned_long *)g_try_malloc0(0x200);
      if (puVar3 == (unsigned_long *)0x0) {
        abort();
      }
      pages_00->code_bitmap = puVar3;
      uVar4 = pages_00->first_tb;
      puVar5 = (uint *)(uVar4 & 0xfffffffffffffffe);
      if (puVar5 != (uint *)0x0) {
        do {
          if ((uVar4 & 1) == 0) {
            uVar2 = *puVar5 & 0xfff;
            uVar1 = (ushort)puVar5[3] + uVar2;
            if (0xfff < uVar1) {
              uVar1 = 0x1000;
            }
          }
          else {
            uVar2 = 0;
            uVar1 = *puVar5 + puVar5[3] & 0xfff;
          }
          qemu_bitmap_set(pages_00->code_bitmap,(ulong)uVar2,(long)(int)(uVar1 - uVar2));
          uVar4 = *(ulong *)(puVar5 + (ulong)((uint)uVar4 & 1) * 2 + 0xc);
          puVar5 = (uint *)(uVar4 & 0xfffffffffffffffe);
        } while (puVar5 != (uint *)0x0);
        puVar3 = pages_00->code_bitmap;
        if (puVar3 == (unsigned_long *)0x0) goto LAB_007e8bae;
      }
    }
    if (((uint)(*(ulong *)((long)puVar3 + (ulong)((uint)(start >> 3) & 0x1f8)) >>
               ((byte)start & 0x3f)) & ~(-1 << ((byte)len & 0x1f))) != 0) {
LAB_007e8bae:
      tb_invalidate_phys_page_range__locked
                (uc,(page_collection *)pages_00,(PageDesc *)start,(long)len + start,retaddr,in_R9);
      return;
    }
  }
  return;
}

Assistant:

void tb_invalidate_phys_page_fast(struct uc_struct *uc, struct page_collection *pages,
                                  tb_page_addr_t start, int len,
                                  uintptr_t retaddr)
{
    PageDesc *p;

    assert_memory_lock();

    p = page_find(uc, start >> TARGET_PAGE_BITS);
    if (!p) {
        return;
    }

    assert_page_locked(p);
    if (!p->code_bitmap &&
        ++p->code_write_count >= SMC_BITMAP_USE_THRESHOLD) {
        build_page_bitmap(uc, p);
    }
    if (p->code_bitmap) {
        unsigned int nr;
        unsigned long b;

        nr = start & ~TARGET_PAGE_MASK;
        b = p->code_bitmap[BIT_WORD(nr)] >> (nr & (BITS_PER_LONG - 1));
        if (b & ((1 << len) - 1)) {
            goto do_invalidate;
        }
    } else {
    do_invalidate:
        tb_invalidate_phys_page_range__locked(uc, pages, p, start, start + len,
                                              retaddr);
    }
}